

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsortfilterproxymodel.cpp
# Opt level: O2

void QSortFilterProxyModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  CaseSensitivity *pCVar1;
  undefined8 uVar2;
  bool bVar3;
  CaseSensitivity CVar4;
  long *plVar5;
  QBindableInterface *pQVar6;
  QRegularExpression *regularExpression;
  long in_FS_OFFSET;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        dynamicSortFilterChanged((QSortFilterProxyModel *)_o,*_a[1]);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        filterCaseSensitivityChanged((QSortFilterProxyModel *)_o,*_a[1]);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        sortCaseSensitivityChanged((QSortFilterProxyModel *)_o,*_a[1]);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        sortLocaleAwareChanged((QSortFilterProxyModel *)_o,*_a[1]);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        sortRoleChanged((QSortFilterProxyModel *)_o,*_a[1]);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        filterRoleChanged((QSortFilterProxyModel *)_o,*_a[1]);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        recursiveFilteringEnabledChanged((QSortFilterProxyModel *)_o,*_a[1]);
        return;
      }
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        autoAcceptChildRowsChanged((QSortFilterProxyModel *)_o,*_a[1]);
        return;
      }
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setFilterRegularExpression((QSortFilterProxyModel *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 9:
      regularExpression = (QRegularExpression *)_a[1];
switchD_0041fd5b_caseD_0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setFilterRegularExpression((QSortFilterProxyModel *)_o,regularExpression);
        return;
      }
      break;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setFilterWildcard((QSortFilterProxyModel *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setFilterFixedString((QSortFilterProxyModel *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0xc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        invalidate((QSortFilterProxyModel *)_o);
        return;
      }
      break;
    default:
      goto switchD_0041fcf4_caseD_3;
    }
    goto LAB_0042036d;
  case ReadProperty:
    if (9 < (uint)_id) break;
    pCVar1 = (CaseSensitivity *)*_a;
    switch(_id) {
    case 0:
      filterRegularExpression((QSortFilterProxyModel *)&local_20);
      uVar2 = *(undefined8 *)pCVar1;
      *(undefined8 *)pCVar1 = local_20;
      local_20 = uVar2;
      QRegularExpression::~QRegularExpression((QRegularExpression *)&local_20);
      goto switchD_0041fcf4_caseD_3;
    case 1:
      CVar4 = filterKeyColumn((QSortFilterProxyModel *)_o);
      break;
    case 2:
      bVar3 = dynamicSortFilter((QSortFilterProxyModel *)_o);
      goto LAB_0042012b;
    case 3:
      CVar4 = filterCaseSensitivity((QSortFilterProxyModel *)_o);
      break;
    case 4:
      CVar4 = sortCaseSensitivity((QSortFilterProxyModel *)_o);
      break;
    case 5:
      bVar3 = isSortLocaleAware((QSortFilterProxyModel *)_o);
      goto LAB_0042012b;
    case 6:
      CVar4 = sortRole((QSortFilterProxyModel *)_o);
      break;
    case 7:
      CVar4 = filterRole((QSortFilterProxyModel *)_o);
      break;
    case 8:
      bVar3 = isRecursiveFilteringEnabled((QSortFilterProxyModel *)_o);
      goto LAB_0042012b;
    case 9:
      bVar3 = autoAcceptChildRows((QSortFilterProxyModel *)_o);
LAB_0042012b:
      *(bool *)pCVar1 = bVar3;
      goto switchD_0041fcf4_caseD_3;
    }
    *pCVar1 = CVar4;
    break;
  case WriteProperty:
    if ((uint)_id < 10) {
      regularExpression = (QRegularExpression *)*_a;
      switch(_id) {
      case 0:
        goto switchD_0041fd5b_caseD_0;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFilterKeyColumn((QSortFilterProxyModel *)_o,*(int *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDynamicSortFilter((QSortFilterProxyModel *)_o,*(bool *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFilterCaseSensitivity
                    ((QSortFilterProxyModel *)_o,*(CaseSensitivity *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setSortCaseSensitivity
                    ((QSortFilterProxyModel *)_o,*(CaseSensitivity *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 5:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setSortLocaleAware((QSortFilterProxyModel *)_o,*(bool *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 6:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setSortRole((QSortFilterProxyModel *)_o,*(int *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 7:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFilterRole((QSortFilterProxyModel *)_o,*(int *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 8:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setRecursiveFilteringEnabled
                    ((QSortFilterProxyModel *)_o,*(bool *)&(regularExpression->d).d.ptr);
          return;
        }
        break;
      case 9:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setAutoAcceptChildRows((QSortFilterProxyModel *)_o,*(bool *)&(regularExpression->d).d.ptr)
          ;
          return;
        }
      }
      goto LAB_0042036d;
    }
    break;
  case IndexOfMethod:
    bVar3 = QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(bool)>
                      ((QtMocHelpers *)_a,(void **)dynamicSortFilterChanged,0,0);
    if ((((!bVar3) &&
         (bVar3 = QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(Qt::CaseSensitivity)>
                            ((QtMocHelpers *)_a,(void **)filterCaseSensitivityChanged,0,1), !bVar3))
        && (bVar3 = QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(Qt::CaseSensitivity)>
                              ((QtMocHelpers *)_a,(void **)sortCaseSensitivityChanged,0,2), !bVar3))
       && (((bVar3 = QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(bool)>
                               ((QtMocHelpers *)_a,(void **)sortLocaleAwareChanged,0,3), !bVar3 &&
            (bVar3 = QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(int)>
                               ((QtMocHelpers *)_a,(void **)sortRoleChanged,0,4), !bVar3)) &&
           ((bVar3 = QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(int)>
                               ((QtMocHelpers *)_a,(void **)filterRoleChanged,0,5), !bVar3 &&
            (bVar3 = QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(bool)>
                               ((QtMocHelpers *)_a,(void **)recursiveFilteringEnabledChanged,0,6),
            !bVar3)))))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QSortFilterProxyModel::*)(bool)>
                  ((QtMocHelpers *)_a,(void **)autoAcceptChildRowsChanged,0,7);
        return;
      }
      goto LAB_0042036d;
    }
    break;
  case BindableProperty:
    switch(_id) {
    case 0:
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[3].children.d.size;
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    case 1:
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[3].children;
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_column_offset,_&QSortFilterProxyModelPrivate::setFilterKeyColumnForwarder,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    case 2:
      plVar5 = (long *)*_a;
      *plVar5 = (long)((long)&(_o->d_ptr).d[3].children.d.ptr + 3);
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_dynamic_sortfilter_offset,_&QSortFilterProxyModelPrivate::setDynamicSortFilterForwarder,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    case 3:
      plVar5 = (long *)*_a;
      *plVar5 = (long)((long)&(_o->d_ptr).d[3].children.d.ptr + 4);
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>,_void>
                ::iface;
      break;
    case 4:
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[3].parent;
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_sort_casesensitivity_offset,_&QSortFilterProxyModelPrivate::setSortCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::sortCaseSensitivityChangedForwarder,_nullptr>,_void>
                ::iface;
      break;
    case 5:
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[3].children.d.ptr;
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_sort_localeaware_offset,_&QSortFilterProxyModelPrivate::setSortLocaleAwareForwarder,_&QSortFilterProxyModelPrivate::sortLocaleAwareChangedForwarder,_nullptr>,_void>
                ::iface;
      break;
    case 6:
      plVar5 = (long *)*_a;
      *plVar5 = (long)((long)&(_o->d_ptr).d[3].parent + 4);
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_sort_role_offset,_&QSortFilterProxyModelPrivate::setSortRoleForwarder,_&QSortFilterProxyModelPrivate::sortRoleChangedForwarder,_nullptr>,_void>
                ::iface;
      break;
    case 7:
      plVar5 = (long *)*_a;
      *plVar5 = (long)((long)&(_o->d_ptr).d[3].children.d.d + 4);
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_int,_&QSortFilterProxyModelPrivate::_qt_property_filter_role_offset,_&QSortFilterProxyModelPrivate::setFilterRoleForwarder,_&QSortFilterProxyModelPrivate::filterRoleChangedForwarder,_nullptr>,_void>
                ::iface;
      break;
    case 8:
      plVar5 = (long *)*_a;
      *plVar5 = (long)((long)&(_o->d_ptr).d[3].children.d.ptr + 1);
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_filter_recursive_offset,_&QSortFilterProxyModelPrivate::setRecursiveFilteringEnabledForwarder,_&QSortFilterProxyModelPrivate::recursiveFilteringEnabledChangedForwarder,_nullptr>,_void>
                ::iface;
      break;
    case 9:
      plVar5 = (long *)*_a;
      *plVar5 = (long)((long)&(_o->d_ptr).d[3].children.d.ptr + 2);
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_accept_children_offset,_&QSortFilterProxyModelPrivate::setAutoAcceptChildRowsForwarder,_&QSortFilterProxyModelPrivate::autoAcceptChildRowsChangedForwarder,_nullptr>,_void>
                ::iface;
      break;
    default:
      goto switchD_0041fcf4_caseD_3;
    }
    plVar5[1] = (long)pQVar6;
  }
switchD_0041fcf4_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0042036d:
  __stack_chk_fail();
}

Assistant:

void QSortFilterProxyModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSortFilterProxyModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->dynamicSortFilterChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->filterCaseSensitivityChanged((*reinterpret_cast< std::add_pointer_t<Qt::CaseSensitivity>>(_a[1]))); break;
        case 2: _t->sortCaseSensitivityChanged((*reinterpret_cast< std::add_pointer_t<Qt::CaseSensitivity>>(_a[1]))); break;
        case 3: _t->sortLocaleAwareChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->sortRoleChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->filterRoleChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->recursiveFilteringEnabledChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 7: _t->autoAcceptChildRowsChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setFilterRegularExpression((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setFilterRegularExpression((*reinterpret_cast< std::add_pointer_t<QRegularExpression>>(_a[1]))); break;
        case 10: _t->setFilterWildcard((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 11: _t->setFilterFixedString((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 12: _t->invalidate(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::dynamicSortFilterChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(Qt::CaseSensitivity )>(_a, &QSortFilterProxyModel::filterCaseSensitivityChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(Qt::CaseSensitivity )>(_a, &QSortFilterProxyModel::sortCaseSensitivityChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::sortLocaleAwareChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(int )>(_a, &QSortFilterProxyModel::sortRoleChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(int )>(_a, &QSortFilterProxyModel::filterRoleChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::recursiveFilteringEnabledChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSortFilterProxyModel::*)(bool )>(_a, &QSortFilterProxyModel::autoAcceptChildRowsChanged, 7))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QRegularExpression*>(_v) = _t->filterRegularExpression(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->filterKeyColumn(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->dynamicSortFilter(); break;
        case 3: *reinterpret_cast<Qt::CaseSensitivity*>(_v) = _t->filterCaseSensitivity(); break;
        case 4: *reinterpret_cast<Qt::CaseSensitivity*>(_v) = _t->sortCaseSensitivity(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isSortLocaleAware(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->sortRole(); break;
        case 7: *reinterpret_cast<int*>(_v) = _t->filterRole(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isRecursiveFilteringEnabled(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->autoAcceptChildRows(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFilterRegularExpression(*reinterpret_cast<QRegularExpression*>(_v)); break;
        case 1: _t->setFilterKeyColumn(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setDynamicSortFilter(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setFilterCaseSensitivity(*reinterpret_cast<Qt::CaseSensitivity*>(_v)); break;
        case 4: _t->setSortCaseSensitivity(*reinterpret_cast<Qt::CaseSensitivity*>(_v)); break;
        case 5: _t->setSortLocaleAware(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setSortRole(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setFilterRole(*reinterpret_cast<int*>(_v)); break;
        case 8: _t->setRecursiveFilteringEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setAutoAcceptChildRows(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterRegularExpression(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterKeyColumn(); break;
        case 2: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDynamicSortFilter(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterCaseSensitivity(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSortCaseSensitivity(); break;
        case 5: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableIsSortLocaleAware(); break;
        case 6: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSortRole(); break;
        case 7: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableFilterRole(); break;
        case 8: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableRecursiveFilteringEnabled(); break;
        case 9: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableAutoAcceptChildRows(); break;
        default: break;
        }
    }
}